

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O2

void __thiscall DataServer::saveFile(DataServer *this)

{
  int __val;
  _Base_ptr p_Var1;
  void *pvVar2;
  _Rb_tree_iterator<std::pair<const_int,_fileRange>_> _Var3;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_fileRange>_>,_std::_Rb_tree_iterator<std::pair<const_int,_fileRange>_>_>
  pVar4;
  _Rb_tree_iterator<std::pair<const_int,_fileRange>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string nodePath;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream myblockFile;
  
  pVar4 = std::
          _Rb_tree<int,_std::pair<const_int,_fileRange>,_std::_Select1st<std::pair<const_int,_fileRange>_>,_std::less<int>,_std::allocator<std::pair<const_int,_fileRange>_>_>
          ::equal_range(&server_fileRangesMap._M_t,&this->serverId);
  std::__cxx11::to_string((string *)&myblockFile,this->serverId);
  std::operator+(&nodePath,"dfsfiles/datanode",(string *)&myblockFile);
  std::__cxx11::string::~string((string *)&myblockFile);
  while (local_300 = pVar4.second._M_node, _Var3 = pVar4.first._M_node,
        _Var3._M_node != local_300._M_node) {
    __val = *(int *)((long)&_Var3._M_node[1]._M_left + 4);
    p_Var1 = _Var3._M_node[1]._M_parent;
    pvVar2 = operator_new__(0x200000);
    std::istream::seekg(0x151788,(_Ios_Seekdir)p_Var1);
    std::istream::read(ifs,(long)pvVar2);
    std::istream::seekg(0x151788,_S_beg);
    std::ofstream::ofstream((string *)&myblockFile);
    std::operator+(&local_290,&nodePath,"/");
    std::operator+(&local_270,&local_290,&desFileName_abi_cxx11_);
    std::operator+(&local_2f0,&local_270,"-part");
    std::__cxx11::to_string(&local_2b0,__val);
    std::operator+(&local_250,&local_2f0,&local_2b0);
    std::ofstream::open((string *)&myblockFile,(_Ios_Openmode)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::ostream::write((char *)&myblockFile,(long)pvVar2);
    std::ofstream::close();
    operator_delete__(pvVar2);
    std::ofstream::~ofstream((string *)&myblockFile);
    _Var3._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var3._M_node);
    pVar4.second._M_node = local_300._M_node;
    pVar4.first._M_node = _Var3._M_node;
  }
  std::__cxx11::string::~string((string *)&nodePath);
  return;
}

Assistant:

void saveFile() const
    {
        // dfs/datanode[1,2,3,4]/
        // check the server_fileRangesMap
        // <serverid, range{from, count, blockid}>
        auto fileRanges = server_fileRangesMap.equal_range(serverId);
        string nodePath = "dfsfiles/datanode" + to_string(serverId);
        for (auto f_it = fileRanges.first; f_it!= fileRanges.second; ++f_it)
        {
            int _blockId = (f_it->second).blockId;
            long long _from = (f_it->second).from;
            int _count = (f_it->second).count;
            char *buffer = new char[block_size_int];
            ifs.seekg(_from, ifs.beg);

            ifs.read(buffer, _count);

            ifs.seekg(0, ifs.beg);

            ofstream myblockFile;

            myblockFile.open(nodePath + "/" + desFileName + "-part" + to_string(_blockId));

            myblockFile.write(buffer, _count);

            myblockFile.close();

            delete[] buffer;
        }


    }